

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

Value * __thiscall
camp::Function::call(Value *__return_storage_ptr__,Function *this,UserObject *object,Args *args)

{
  bool bVar1;
  size_t sVar2;
  ForbiddenCall *__return_storage_ptr___00;
  NotEnoughArguments *__return_storage_ptr___01;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  NotEnoughArguments local_b8;
  ForbiddenCall local_70;
  
  bVar1 = detail::Getter<bool>::get(&this->m_callable,object);
  if (!bVar1) {
    __return_storage_ptr___00 = (ForbiddenCall *)__cxa_allocate_exception(0x48);
    ForbiddenCall::ForbiddenCall(&local_70,&this->m_name);
    std::__cxx11::string::string
              ((string *)&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
               ,&local_f9);
    std::__cxx11::string::string
              ((string *)&local_f8,
               "Value camp::Function::call(const UserObject &, const Args &) const",&local_fa);
    Error::prepare<camp::ForbiddenCall>
              (__return_storage_ptr___00,&local_70,&local_d8,0x52,&local_f8);
    __cxa_throw(__return_storage_ptr___00,&ForbiddenCall::typeinfo,Error::~Error);
  }
  sVar2 = Args::count(args);
  if ((ulong)((long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) <= sVar2) {
    (*(this->super_TagHolder)._vptr_TagHolder[3])(__return_storage_ptr__,this,object,args);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___01 = (NotEnoughArguments *)__cxa_allocate_exception(0x48);
  sVar2 = Args::count(args);
  NotEnoughArguments::NotEnoughArguments
            (&local_b8,&this->m_name,sVar2,
             (long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_argTypes).super__Vector_base<camp::Type,_std::allocator<camp::Type>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/function.cpp"
             ,&local_f9);
  std::__cxx11::string::string
            ((string *)&local_f8,
             "Value camp::Function::call(const UserObject &, const Args &) const",&local_fa);
  Error::prepare<camp::NotEnoughArguments>
            (__return_storage_ptr___01,&local_b8,&local_d8,0x56,&local_f8);
  __cxa_throw(__return_storage_ptr___01,&NotEnoughArguments::typeinfo,Error::~Error);
}

Assistant:

Value Function::call(const UserObject& object, const Args& args) const
{
    // Check if the function is callable
    if (!callable(object))
        CAMP_ERROR(ForbiddenCall(name()));

    // Check the number of arguments
    if (args.count() < m_argTypes.size())
        CAMP_ERROR(NotEnoughArguments(name(), args.count(), m_argTypes.size()));

    // Execute the function
    return execute(object, args);
}